

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_sse2.c
# Opt level: O1

_Bool av1_resize_vert_dir_sse2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  ushort uVar44;
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  unkuint9 Var55;
  undefined1 auVar56 [11];
  undefined1 auVar57 [15];
  unkuint9 Var58;
  undefined1 auVar59 [11];
  undefined1 auVar60 [15];
  undefined1 auVar61 [11];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  _Bool _Var76;
  ulong *puVar77;
  long lVar78;
  uint uVar79;
  uint8_t *puVar80;
  ulong uVar81;
  uint8_t *puVar82;
  long lVar83;
  long lVar84;
  short sVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i l7;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar95;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  short sVar100;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  
  auVar75 = _DAT_0056f4f0;
  auVar74 = _DAT_0056f4e0;
  uVar79 = start_col;
  if (7 < height && (height & 1U) == 0) {
    uVar79 = stride + 7;
    if (-1 < stride) {
      uVar79 = stride;
    }
    uVar79 = uVar79 & 0xfffffff8;
    if (start_col < (int)uVar79) {
      lVar83 = (long)stride;
      lVar78 = (long)start_col;
      puVar82 = output + lVar78;
      do {
        puVar77 = (ulong *)(intbuf + stride * 3 + lVar78);
        uVar81 = *(ulong *)(intbuf + lVar78);
        uVar1 = *(ulong *)(intbuf + lVar83 + lVar78);
        uVar2 = *(ulong *)(intbuf + lVar83 * 2 + lVar78);
        auVar8._8_6_ = 0;
        auVar8._0_8_ = uVar81;
        auVar8[0xe] = (char)(uVar81 >> 0x38);
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar81;
        auVar14[0xc] = (char)(uVar81 >> 0x30);
        auVar14._13_2_ = auVar8._13_2_;
        auVar20._8_4_ = 0;
        auVar20._0_8_ = uVar81;
        auVar20._12_3_ = auVar14._12_3_;
        auVar26._8_2_ = 0;
        auVar26._0_8_ = uVar81;
        auVar26[10] = (char)(uVar81 >> 0x28);
        auVar26._11_4_ = auVar20._11_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar81;
        auVar32._10_5_ = auVar26._10_5_;
        auVar38[8] = (char)(uVar81 >> 0x20);
        auVar38._0_8_ = uVar81;
        auVar38._9_6_ = auVar32._9_6_;
        auVar51._7_8_ = 0;
        auVar51._0_7_ = auVar38._8_7_;
        auVar62._1_8_ = SUB158(auVar51 << 0x40,7);
        auVar62[0] = (char)(uVar81 >> 0x18);
        auVar62._9_6_ = 0;
        auVar63._1_10_ = SUB1510(auVar62 << 0x30,5);
        auVar63[0] = (char)(uVar81 >> 0x10);
        auVar63._11_4_ = 0;
        auVar45[2] = (char)(uVar81 >> 8);
        auVar45._0_2_ = (ushort)uVar81;
        auVar45._3_12_ = SUB1512(auVar63 << 0x20,3);
        auVar99._0_2_ = (ushort)uVar81 & 0xff;
        auVar99._2_13_ = auVar45._2_13_;
        auVar99[0xf] = 0;
        auVar9._8_6_ = 0;
        auVar9._0_8_ = uVar1;
        auVar9[0xe] = (char)(uVar1 >> 0x38);
        auVar15._8_4_ = 0;
        auVar15._0_8_ = uVar1;
        auVar15[0xc] = (char)(uVar1 >> 0x30);
        auVar15._13_2_ = auVar9._13_2_;
        auVar21._8_4_ = 0;
        auVar21._0_8_ = uVar1;
        auVar21._12_3_ = auVar15._12_3_;
        auVar27._8_2_ = 0;
        auVar27._0_8_ = uVar1;
        auVar27[10] = (char)(uVar1 >> 0x28);
        auVar27._11_4_ = auVar21._11_4_;
        auVar33._8_2_ = 0;
        auVar33._0_8_ = uVar1;
        auVar33._10_5_ = auVar27._10_5_;
        auVar39[8] = (char)(uVar1 >> 0x20);
        auVar39._0_8_ = uVar1;
        auVar39._9_6_ = auVar33._9_6_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar39._8_7_;
        auVar64._1_8_ = SUB158(auVar52 << 0x40,7);
        auVar64[0] = (char)(uVar1 >> 0x18);
        auVar64._9_6_ = 0;
        auVar65._1_10_ = SUB1510(auVar64 << 0x30,5);
        auVar65[0] = (char)(uVar1 >> 0x10);
        auVar65._11_4_ = 0;
        auVar46[2] = (char)(uVar1 >> 8);
        auVar46._0_2_ = (ushort)uVar1;
        auVar46._3_12_ = SUB1512(auVar65 << 0x20,3);
        auVar87._0_2_ = (ushort)uVar1 & 0xff;
        auVar87._2_13_ = auVar46._2_13_;
        auVar87[0xf] = 0;
        auVar10._8_6_ = 0;
        auVar10._0_8_ = uVar2;
        auVar10[0xe] = (char)(uVar2 >> 0x38);
        auVar16._8_4_ = 0;
        auVar16._0_8_ = uVar2;
        auVar16[0xc] = (char)(uVar2 >> 0x30);
        auVar16._13_2_ = auVar10._13_2_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar2;
        auVar22._12_3_ = auVar16._12_3_;
        auVar28._8_2_ = 0;
        auVar28._0_8_ = uVar2;
        auVar28[10] = (char)(uVar2 >> 0x28);
        auVar28._11_4_ = auVar22._11_4_;
        auVar34._8_2_ = 0;
        auVar34._0_8_ = uVar2;
        auVar34._10_5_ = auVar28._10_5_;
        auVar40[8] = (char)(uVar2 >> 0x20);
        auVar40._0_8_ = uVar2;
        auVar40._9_6_ = auVar34._9_6_;
        auVar53._7_8_ = 0;
        auVar53._0_7_ = auVar40._8_7_;
        auVar66._1_8_ = SUB158(auVar53 << 0x40,7);
        auVar66[0] = (char)(uVar2 >> 0x18);
        auVar66._9_6_ = 0;
        auVar67._1_10_ = SUB1510(auVar66 << 0x30,5);
        auVar67[0] = (char)(uVar2 >> 0x10);
        auVar67._11_4_ = 0;
        auVar47[2] = (char)(uVar2 >> 8);
        auVar47._0_2_ = (ushort)uVar2;
        auVar47._3_12_ = SUB1512(auVar67 << 0x20,3);
        auVar93._0_2_ = (ushort)uVar2 & 0xff;
        auVar93._2_13_ = auVar47._2_13_;
        auVar93[0xf] = 0;
        auVar89 = auVar99;
        auVar90 = auVar99;
        auVar92 = auVar99;
        if (4 < height) {
          lVar84 = 0;
          puVar80 = puVar82;
          auVar85 = auVar99;
          auVar91 = auVar99;
          do {
            auVar99 = auVar89;
            auVar92 = auVar90;
            auVar90 = auVar93;
            auVar89 = auVar87;
            uVar81 = *puVar77;
            uVar1 = *(ulong *)((long)puVar77 + lVar83);
            auVar11._8_6_ = 0;
            auVar11._0_8_ = uVar81;
            auVar11[0xe] = (char)(uVar81 >> 0x38);
            auVar17._8_4_ = 0;
            auVar17._0_8_ = uVar81;
            auVar17[0xc] = (char)(uVar81 >> 0x30);
            auVar17._13_2_ = auVar11._13_2_;
            auVar23._8_4_ = 0;
            auVar23._0_8_ = uVar81;
            auVar23._12_3_ = auVar17._12_3_;
            auVar29._8_2_ = 0;
            auVar29._0_8_ = uVar81;
            auVar29[10] = (char)(uVar81 >> 0x28);
            auVar29._11_4_ = auVar23._11_4_;
            auVar35._8_2_ = 0;
            auVar35._0_8_ = uVar81;
            auVar35._10_5_ = auVar29._10_5_;
            auVar41[8] = (char)(uVar81 >> 0x20);
            auVar41._0_8_ = uVar81;
            auVar41._9_6_ = auVar35._9_6_;
            auVar54._7_8_ = 0;
            auVar54._0_7_ = auVar41._8_7_;
            Var55 = CONCAT81(SUB158(auVar54 << 0x40,7),(char)(uVar81 >> 0x18));
            auVar68._9_6_ = 0;
            auVar68._0_9_ = Var55;
            auVar56._1_10_ = SUB1510(auVar68 << 0x30,5);
            auVar56[0] = (char)(uVar81 >> 0x10);
            auVar69._11_4_ = 0;
            auVar69._0_11_ = auVar56;
            auVar48[2] = (char)(uVar81 >> 8);
            auVar48._0_2_ = (ushort)uVar81;
            auVar48._3_12_ = SUB1512(auVar69 << 0x20,3);
            auVar87._0_2_ = (ushort)uVar81 & 0xff;
            auVar87._2_13_ = auVar48._2_13_;
            auVar87[0xf] = 0;
            auVar12._8_6_ = 0;
            auVar12._0_8_ = uVar1;
            auVar12[0xe] = (char)(uVar1 >> 0x38);
            auVar18._8_4_ = 0;
            auVar18._0_8_ = uVar1;
            auVar18[0xc] = (char)(uVar1 >> 0x30);
            auVar18._13_2_ = auVar12._13_2_;
            auVar24._8_4_ = 0;
            auVar24._0_8_ = uVar1;
            auVar24._12_3_ = auVar18._12_3_;
            auVar30._8_2_ = 0;
            auVar30._0_8_ = uVar1;
            auVar30[10] = (char)(uVar1 >> 0x28);
            auVar30._11_4_ = auVar24._11_4_;
            auVar36._8_2_ = 0;
            auVar36._0_8_ = uVar1;
            auVar36._10_5_ = auVar30._10_5_;
            auVar42[8] = (char)(uVar1 >> 0x20);
            auVar42._0_8_ = uVar1;
            auVar42._9_6_ = auVar36._9_6_;
            auVar57._7_8_ = 0;
            auVar57._0_7_ = auVar42._8_7_;
            Var58 = CONCAT81(SUB158(auVar57 << 0x40,7),(char)(uVar1 >> 0x18));
            auVar70._9_6_ = 0;
            auVar70._0_9_ = Var58;
            auVar59._1_10_ = SUB1510(auVar70 << 0x30,5);
            auVar59[0] = (char)(uVar1 >> 0x10);
            auVar71._11_4_ = 0;
            auVar71._0_11_ = auVar59;
            auVar49[2] = (char)(uVar1 >> 8);
            auVar49._0_2_ = (ushort)uVar1;
            auVar49._3_12_ = SUB1512(auVar71 << 0x20,3);
            auVar93._0_2_ = (ushort)uVar1 & 0xff;
            auVar93._2_13_ = auVar49._2_13_;
            auVar93[0xf] = 0;
            sVar88 = auVar85._6_2_ + (short)Var58;
            sVar100 = auVar90._6_2_ + auVar99._6_2_;
            auVar104._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar91._6_2_ + (short)Var55,sVar88),
                                    auVar91._4_2_ + auVar56._0_2_),
                           CONCAT22(auVar85._4_2_ + auVar59._0_2_,sVar88)) >> 0x10);
            auVar104._6_2_ = auVar91._2_2_ + auVar48._2_2_;
            auVar104._4_2_ = auVar85._2_2_ + auVar49._2_2_;
            auVar104._2_2_ = auVar91._0_2_ + auVar87._0_2_;
            auVar104._0_2_ = auVar85._0_2_ + auVar93._0_2_;
            auVar103._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar89._6_2_ + auVar92._6_2_,sVar100),
                                    auVar89._4_2_ + auVar92._4_2_),
                           CONCAT22(auVar90._4_2_ + auVar99._4_2_,sVar100)) >> 0x10);
            auVar103._6_2_ = auVar89._2_2_ + auVar92._2_2_;
            auVar103._4_2_ = auVar90._2_2_ + auVar99._2_2_;
            auVar103._2_2_ = auVar89._0_2_ + auVar92._0_2_;
            auVar103._0_2_ = auVar90._0_2_ + auVar99._0_2_;
            auVar97._2_2_ = auVar91._8_2_ + auVar41._8_2_;
            auVar97._0_2_ = auVar85._8_2_ + auVar42._8_2_;
            auVar97._4_2_ = auVar85._10_2_ + auVar30._10_2_;
            auVar97._6_2_ = auVar91._10_2_ + auVar29._10_2_;
            auVar97._8_2_ = auVar85._12_2_ + auVar18._12_2_;
            auVar97._10_2_ = auVar91._12_2_ + auVar17._12_2_;
            auVar97._12_2_ = auVar85._14_2_ + (auVar12._13_2_ >> 8);
            auVar97._14_2_ = auVar91._14_2_ + (auVar11._13_2_ >> 8);
            auVar96._2_2_ = auVar89._8_2_ + auVar92._8_2_;
            auVar96._0_2_ = auVar90._8_2_ + auVar99._8_2_;
            auVar96._4_2_ = auVar90._10_2_ + auVar99._10_2_;
            auVar96._6_2_ = auVar89._10_2_ + auVar92._10_2_;
            auVar96._8_2_ = auVar90._12_2_ + auVar99._12_2_;
            auVar96._10_2_ = auVar89._12_2_ + auVar92._12_2_;
            auVar96._12_2_ = auVar90._14_2_ + auVar99._14_2_;
            auVar96._14_2_ = auVar89._14_2_ + auVar92._14_2_;
            auVar91 = pmaddwd(auVar104,auVar74);
            auVar104 = pmaddwd(auVar103,auVar75);
            auVar85 = pmaddwd(auVar97,auVar74);
            auVar97 = pmaddwd(auVar96,auVar75);
            auVar105._0_4_ = auVar104._0_4_ + 0x40 + auVar91._0_4_ >> 7;
            auVar105._4_4_ = auVar104._4_4_ + 0x40 + auVar91._4_4_ >> 7;
            auVar105._8_4_ = auVar104._8_4_ + 0x40 + auVar91._8_4_ >> 7;
            auVar105._12_4_ = auVar104._12_4_ + 0x40 + auVar91._12_4_ >> 7;
            auVar91._0_4_ = auVar97._0_4_ + 0x40 + auVar85._0_4_ >> 7;
            auVar91._4_4_ = auVar97._4_4_ + 0x40 + auVar85._4_4_ >> 7;
            auVar91._8_4_ = auVar97._8_4_ + 0x40 + auVar85._8_4_ >> 7;
            auVar91._12_4_ = auVar97._12_4_ + 0x40 + auVar85._12_4_ >> 7;
            auVar85 = packssdw(auVar105,auVar91);
            sVar88 = auVar85._0_2_;
            sVar100 = auVar85._2_2_;
            sVar95 = auVar85._4_2_;
            sVar3 = auVar85._6_2_;
            sVar4 = auVar85._8_2_;
            sVar5 = auVar85._10_2_;
            sVar6 = auVar85._12_2_;
            sVar7 = auVar85._14_2_;
            *(ulong *)puVar80 =
                 CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar85[0xe] - (0xff < sVar7),
                          CONCAT16((0 < sVar6) * (sVar6 < 0x100) * auVar85[0xc] - (0xff < sVar6),
                                   CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar85[10] -
                                            (0xff < sVar5),
                                            CONCAT14((0 < sVar4) * (sVar4 < 0x100) * auVar85[8] -
                                                     (0xff < sVar4),
                                                     CONCAT13((0 < sVar3) * (sVar3 < 0x100) *
                                                              auVar85[6] - (0xff < sVar3),
                                                              CONCAT12((0 < sVar95) *
                                                                       (sVar95 < 0x100) * auVar85[4]
                                                                       - (0xff < sVar95),
                                                                       CONCAT11((0 < sVar100) *
                                                                                (sVar100 < 0x100) *
                                                                                auVar85[2] -
                                                                                (0xff < sVar100),
                                                                                (0 < sVar88) *
                                                                                (sVar88 < 0x100) *
                                                                                auVar85[0] -
                                                                                (0xff < sVar88))))))
                                  ));
            puVar77 = (ulong *)((long)puVar77 + lVar83 * 2);
            lVar84 = lVar84 + 2;
            puVar80 = puVar80 + out_stride;
            auVar85 = auVar99;
            auVar91 = auVar92;
          } while (lVar84 < height + -4);
        }
        uVar81 = *puVar77;
        auVar13._8_6_ = 0;
        auVar13._0_8_ = uVar81;
        auVar13[0xe] = (char)(uVar81 >> 0x38);
        auVar19._8_4_ = 0;
        auVar19._0_8_ = uVar81;
        auVar19[0xc] = (char)(uVar81 >> 0x30);
        auVar19._13_2_ = auVar13._13_2_;
        auVar25._8_4_ = 0;
        auVar25._0_8_ = uVar81;
        auVar25._12_3_ = auVar19._12_3_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar81;
        auVar31[10] = (char)(uVar81 >> 0x28);
        auVar31._11_4_ = auVar25._11_4_;
        auVar37._8_2_ = 0;
        auVar37._0_8_ = uVar81;
        auVar37._10_5_ = auVar31._10_5_;
        auVar43[8] = (char)(uVar81 >> 0x20);
        auVar43._0_8_ = uVar81;
        auVar43._9_6_ = auVar37._9_6_;
        auVar60._7_8_ = 0;
        auVar60._0_7_ = auVar43._8_7_;
        Var55 = CONCAT81(SUB158(auVar60 << 0x40,7),(char)(uVar81 >> 0x18));
        auVar72._9_6_ = 0;
        auVar72._0_9_ = Var55;
        auVar61._1_10_ = SUB1510(auVar72 << 0x30,5);
        auVar61[0] = (char)(uVar81 >> 0x10);
        auVar73._11_4_ = 0;
        auVar73._0_11_ = auVar61;
        auVar50[2] = (char)(uVar81 >> 8);
        auVar50._0_2_ = (ushort)uVar81;
        auVar50._3_12_ = SUB1512(auVar73 << 0x20,3);
        auVar85._0_2_ = (ushort)uVar81 & 0xff;
        auVar85._2_13_ = auVar50._2_13_;
        auVar85[0xf] = 0;
        uVar81 = (long)(height + -4);
        do {
          auVar97 = auVar90;
          auVar90 = auVar93;
          auVar91 = auVar87;
          sVar100 = (short)Var55;
          sVar88 = auVar99._6_2_ + sVar100;
          uVar44 = auVar13._13_2_ >> 8;
          sVar95 = auVar89._6_2_ + auVar90._6_2_;
          auVar98._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar92._6_2_ + sVar100,sVar88),
                                  auVar92._4_2_ + auVar61._0_2_),
                         CONCAT22(auVar99._4_2_ + auVar61._0_2_,sVar88)) >> 0x10);
          auVar98._6_2_ = auVar92._2_2_ + auVar50._2_2_;
          auVar98._4_2_ = auVar99._2_2_ + auVar50._2_2_;
          auVar98._2_2_ = auVar92._0_2_ + auVar85._0_2_;
          auVar98._0_2_ = auVar99._0_2_ + auVar85._0_2_;
          auVar86._2_2_ = auVar92._8_2_ + auVar43._8_2_;
          auVar86._0_2_ = auVar99._8_2_ + auVar43._8_2_;
          auVar86._4_2_ = auVar99._10_2_ + auVar31._10_2_;
          auVar86._6_2_ = auVar92._10_2_ + auVar31._10_2_;
          auVar86._8_2_ = auVar99._12_2_ + auVar19._12_2_;
          auVar86._10_2_ = auVar92._12_2_ + auVar19._12_2_;
          auVar86._12_2_ = auVar99._14_2_ + uVar44;
          auVar86._14_2_ = auVar92._14_2_ + uVar44;
          auVar101._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar97._6_2_ + auVar91._6_2_,sVar95),
                                  auVar97._4_2_ + auVar91._4_2_),
                         CONCAT22(auVar89._4_2_ + auVar90._4_2_,sVar95)) >> 0x10);
          auVar101._6_2_ = auVar97._2_2_ + auVar91._2_2_;
          auVar101._4_2_ = auVar89._2_2_ + auVar90._2_2_;
          auVar101._2_2_ = auVar97._0_2_ + auVar91._0_2_;
          auVar101._0_2_ = auVar89._0_2_ + auVar90._0_2_;
          auVar92._2_2_ = auVar97._8_2_ + auVar91._8_2_;
          auVar92._0_2_ = auVar89._8_2_ + auVar90._8_2_;
          auVar92._4_2_ = auVar89._10_2_ + auVar90._10_2_;
          auVar92._6_2_ = auVar97._10_2_ + auVar91._10_2_;
          auVar92._8_2_ = auVar89._12_2_ + auVar90._12_2_;
          auVar92._10_2_ = auVar97._12_2_ + auVar91._12_2_;
          auVar92._12_2_ = auVar89._14_2_ + auVar90._14_2_;
          auVar92._14_2_ = auVar97._14_2_ + auVar91._14_2_;
          auVar99 = pmaddwd(auVar98,auVar74);
          auVar104 = pmaddwd(auVar101,auVar75);
          auVar87 = pmaddwd(auVar86,auVar74);
          auVar93 = pmaddwd(auVar92,auVar75);
          auVar102._0_4_ = auVar104._0_4_ + auVar99._0_4_ + 0x40 >> 7;
          auVar102._4_4_ = auVar104._4_4_ + auVar99._4_4_ + 0x40 >> 7;
          auVar102._8_4_ = auVar104._8_4_ + auVar99._8_4_ + 0x40 >> 7;
          auVar102._12_4_ = auVar104._12_4_ + auVar99._12_4_ + 0x40 >> 7;
          auVar94._0_4_ = auVar93._0_4_ + auVar87._0_4_ + 0x40 >> 7;
          auVar94._4_4_ = auVar93._4_4_ + auVar87._4_4_ + 0x40 >> 7;
          auVar94._8_4_ = auVar93._8_4_ + auVar87._8_4_ + 0x40 >> 7;
          auVar94._12_4_ = auVar93._12_4_ + auVar87._12_4_ + 0x40 >> 7;
          auVar87 = packssdw(auVar102,auVar94);
          sVar88 = auVar87._0_2_;
          sVar100 = auVar87._2_2_;
          sVar95 = auVar87._4_2_;
          sVar3 = auVar87._6_2_;
          sVar4 = auVar87._8_2_;
          sVar5 = auVar87._10_2_;
          sVar6 = auVar87._12_2_;
          sVar7 = auVar87._14_2_;
          *(ulong *)(output + (int)(((uint)(uVar81 >> 1) & 0x7fffffff) * out_stride) + lVar78) =
               CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar87[0xe] - (0xff < sVar7),
                        CONCAT16((0 < sVar6) * (sVar6 < 0x100) * auVar87[0xc] - (0xff < sVar6),
                                 CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar87[10] -
                                          (0xff < sVar5),
                                          CONCAT14((0 < sVar4) * (sVar4 < 0x100) * auVar87[8] -
                                                   (0xff < sVar4),
                                                   CONCAT13((0 < sVar3) * (sVar3 < 0x100) *
                                                            auVar87[6] - (0xff < sVar3),
                                                            CONCAT12((0 < sVar95) * (sVar95 < 0x100)
                                                                     * auVar87[4] - (0xff < sVar95),
                                                                     CONCAT11((0 < sVar100) *
                                                                              (sVar100 < 0x100) *
                                                                              auVar87[2] -
                                                                              (0xff < sVar100),
                                                                              (0 < sVar88) *
                                                                              (sVar88 < 0x100) *
                                                                              auVar87[0] -
                                                                              (0xff < sVar88))))))))
          ;
          uVar81 = uVar81 + 2;
          auVar87 = auVar85;
          auVar93 = auVar85;
          auVar99 = auVar89;
          auVar89 = auVar91;
          auVar92 = auVar97;
        } while ((long)uVar81 < (long)(ulong)(uint)height);
        lVar78 = lVar78 + 8;
        puVar82 = puVar82 + 8;
      } while (lVar78 < (int)uVar79);
    }
    if (stride % 8 == 0) {
      return true;
    }
  }
  _Var76 = av1_resize_vert_dir_c(intbuf,output,out_stride,height,height2,stride,uVar79);
  return _Var76;
}

Assistant:

bool av1_resize_vert_dir_sse2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m128i coeffs_y[2];
  const int bits = FILTER_BITS;
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const uint8_t max_pixel = 255;
  const __m128i clip_pixel = _mm_set1_epi8((char)max_pixel);
  const __m128i zero = _mm_setzero_si128();
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int remain_col = stride % 8;

  for (int j = start_col; j < stride - remain_col; j += 8) {
    uint8_t *data = &intbuf[j];
    // d0 ... d7
    const __m128i l8_3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    // a0 ... a7
    const __m128i l8_0 = l8_3;
    // b0 ... b7
    const __m128i l8_1 = l8_3;
    // c0 ... c7
    const __m128i l8_2 = l8_3;
    // e0 ... e7
    const __m128i l8_4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));
    // f0 ... f7
    const __m128i l8_5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));

    // Convert to 16bit as addition of 2 source pixel crosses 8 bit.
    __m128i l0 = _mm_unpacklo_epi8(l8_0, zero);  // A(128bit) = a0 - a7(16 bit)
    __m128i l1 = _mm_unpacklo_epi8(l8_1, zero);  // B(128bit) = b0 - b7(16 bit)
    __m128i l2 = _mm_unpacklo_epi8(l8_2, zero);  // C(128bit) = c0 - c7(16 bit)
    __m128i l3 = _mm_unpacklo_epi8(l8_3, zero);  // D(128bit) = d0 - d7(16 bit)
    __m128i l4 = _mm_unpacklo_epi8(l8_4, zero);  // E(128bit) = e0 - e7(16 bit)
    __m128i l5 = _mm_unpacklo_epi8(l8_5, zero);  // F(128bit) = f0 - f7(16 bit)

    // Increment the pointer such that the loading starts from row G.
    data = data + 3 * stride;
    // The core vertical SIMD processes 2 input rows simultaneously to generate
    // output corresponding to 1 row. To streamline the core loop and eliminate
    // the need for conditional checks, the remaining rows 4 are processed
    // separately.
    for (int i = 0; i < height - 4; i += 2) {
      // g0 ... g7
      __m128i l8_6 = _mm_loadl_epi64((__m128i *)(data));
      // h0 ... h7
      __m128i l8_7 = _mm_loadl_epi64((__m128i *)(data + stride));
      __m128i l6 = _mm_unpacklo_epi8(l8_6, zero);  // G(128bit):g0-g7(16b)
      __m128i l7 = _mm_unpacklo_epi8(l8_7, zero);  // H(128bit):h0-h7(16b)

      PROCESS_RESIZE_Y_WD8
    }

    __m128i l8_6 = _mm_loadl_epi64((__m128i *)(data));
    __m128i l6 = _mm_unpacklo_epi8(l8_6, zero);
    // Process the last 4 input rows here.
    for (int i = height - 4; i < height; i += 2) {
      __m128i l7 = l6;
      PROCESS_RESIZE_Y_WD8
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}